

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::setTextureStorage
               (CallLogWrapper *glLog,TextureType imageType,deUint32 internalFormat,IVec3 *imageSize
               ,deUint32 textureBufGL)

{
  ChannelOrder target;
  int iVar1;
  int iVar2;
  int depth;
  TextureFormat TStack_30;
  int numBytes;
  TextureFormat format;
  deUint32 textureTarget;
  deUint32 textureBufGL_local;
  IVec3 *imageSize_local;
  deUint32 internalFormat_local;
  TextureType imageType_local;
  CallLogWrapper *glLog_local;
  
  format.type = textureBufGL;
  target = Functional::getGLTextureTarget(imageType);
  format.order = target;
  if (imageType < TEXTURETYPE_2D_ARRAY) {
    iVar1 = tcu::Vector<int,_3>::x(imageSize);
    iVar2 = tcu::Vector<int,_3>::y(imageSize);
    glu::CallLogWrapper::glTexStorage2D(glLog,target,1,internalFormat,iVar1,iVar2);
  }
  else if (imageType - TEXTURETYPE_2D_ARRAY < 2) {
    iVar1 = tcu::Vector<int,_3>::x(imageSize);
    iVar2 = tcu::Vector<int,_3>::y(imageSize);
    depth = tcu::Vector<int,_3>::z(imageSize);
    glu::CallLogWrapper::glTexStorage3D(glLog,target,1,internalFormat,iVar1,iVar2,depth);
  }
  else if (imageType == TEXTURETYPE_BUFFER) {
    TStack_30 = glu::mapGLInternalFormat(internalFormat);
    iVar1 = tcu::TextureFormat::getPixelSize(&stack0xffffffffffffffd0);
    iVar2 = tcu::Vector<int,_3>::x(imageSize);
    glu::CallLogWrapper::glBindBuffer(glLog,0x8c2a,format.type);
    glu::CallLogWrapper::glBufferData(glLog,0x8c2a,(long)(iVar1 * iVar2),(void *)0x0,0x88e4);
    glu::CallLogWrapper::glTexBuffer(glLog,0x8c2a,internalFormat,format.type);
  }
  return;
}

Assistant:

static void setTextureStorage (glu::CallLogWrapper& glLog, TextureType imageType, deUint32 internalFormat, const IVec3& imageSize, deUint32 textureBufGL)
{
	const deUint32 textureTarget = getGLTextureTarget(imageType);

	switch (imageType)
	{
		case TEXTURETYPE_BUFFER:
		{
			const TextureFormat		format		= glu::mapGLInternalFormat(internalFormat);
			const int				numBytes	= format.getPixelSize() * imageSize.x();
			DE_ASSERT(isFormatSupportedForTextureBuffer(format));
			glLog.glBindBuffer(GL_TEXTURE_BUFFER, textureBufGL);
			glLog.glBufferData(GL_TEXTURE_BUFFER, numBytes, DE_NULL, GL_STATIC_DRAW);
			glLog.glTexBuffer(GL_TEXTURE_BUFFER, internalFormat, textureBufGL);
			DE_ASSERT(imageSize.y() == 1 && imageSize.z() == 1);
			break;
		}

		// \note Fall-throughs.

		case TEXTURETYPE_2D:
		case TEXTURETYPE_CUBE:
			glLog.glTexStorage2D(textureTarget, 1, internalFormat, imageSize.x(), imageSize.y());
			DE_ASSERT(imageSize.z() == 1);
			break;

		case TEXTURETYPE_3D:
		case TEXTURETYPE_2D_ARRAY:
			glLog.glTexStorage3D(textureTarget, 1, internalFormat, imageSize.x(), imageSize.y(), imageSize.z());
			break;

		default:
			DE_ASSERT(false);
	}
}